

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wskey.cpp
# Opt level: O0

sha1 * __thiscall pstore::http::sha1::input(sha1 *this,span<const_unsigned_char,__1L> *span)

{
  type tVar1;
  ulong uVar2;
  bool bVar3;
  pointer peVar4;
  reference ptVar5;
  reference pvVar6;
  uint64_t old_length;
  undefined1 local_48 [7];
  uint8_t b;
  iterator __end2;
  iterator __begin2;
  span<const_unsigned_char,__1L> *__range2;
  span<const_unsigned_char,__1L> *span_local;
  sha1 *this_local;
  
  peVar4 = pstore::gsl::span<const_unsigned_char,_-1L>::data(span);
  if (((peVar4 != (pointer)0x0) && ((this->computed_ & 1U) == 0)) && ((this->corrupted_ & 1U) == 0))
  {
    pstore::gsl::span<const_unsigned_char,_-1L>::begin
              ((span<const_unsigned_char,__1L> *)&__end2.index_);
    pstore::gsl::span<const_unsigned_char,_-1L>::end((span<const_unsigned_char,__1L> *)local_48);
    while (bVar3 = pstore::gsl::details::operator!=
                             ((span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> *)
                              &__end2.index_,
                              (span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> *)
                              local_48), bVar3) {
      ptVar5 = pstore::gsl::details::
               span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::operator*
                         ((span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> *)
                          &__end2.index_);
      tVar1 = *ptVar5;
      pvVar6 = std::array<unsigned_char,_64UL>::operator[]
                         (&this->message_block_,(ulong)this->index_);
      *pvVar6 = tVar1;
      this->index_ = this->index_ + 1;
      uVar2 = this->length_;
      this->length_ = this->length_ + 8;
      if (this->length_ < uVar2) {
        this->corrupted_ = true;
        return this;
      }
      if (this->index_ == 0x40) {
        process_message_block(this);
      }
      pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
      operator++((span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> *)&__end2.index_
                );
    }
  }
  return this;
}

Assistant:

sha1 & sha1::input (gsl::span<std::uint8_t const> const & span) noexcept {
            if (span.data () == nullptr || computed_ || corrupted_) {
                return *this;
            }

            for (std::uint8_t const b : span) {
                message_block_[index_] = b;
                ++index_;

                auto const old_length = length_;
                length_ += 8;
                if (length_ < old_length) { // Detect overflow.
                    corrupted_ = true;      // Message is too long.
                    break;
                }

                if (index_ == 64) {
                    this->process_message_block ();
                }
            }
            return *this;
        }